

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O0

Roaring64Map * __thiscall
doublechecked::Roaring64Map::operator&=(Roaring64Map *this,Roaring64Map *r)

{
  const_iterator __first;
  bool bVar1;
  reference puVar2;
  Roaring64Map *in_RSI;
  Roaring64Map *in_RDI;
  iterator r_it;
  iterator it;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffff78;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffff88;
  const_iterator in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar3;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  _Self local_18;
  
  roaring::Roaring64Map::operator&=(&in_RDI->plain,in_RSI);
  local_18._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                 (in_stack_ffffffffffffff78);
  local_20._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                 (in_stack_ffffffffffffff78);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                   (in_stack_ffffffffffffff78);
    bVar1 = std::operator!=(&local_18,&local_28);
    uVar3 = false;
    if (bVar1) {
      local_30._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                     (in_stack_ffffffffffffff78);
      uVar3 = std::operator!=(&local_20,&local_30);
    }
    if ((bool)uVar3 == false) break;
    puVar2 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                       ((_Rb_tree_const_iterator<unsigned_long> *)0x1231df);
    in_stack_ffffffffffffff90._M_node = (_Base_ptr)*puVar2;
    puVar2 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                       ((_Rb_tree_const_iterator<unsigned_long> *)0x1231f1);
    if (in_stack_ffffffffffffff90._M_node < (_Base_ptr)*puVar2) {
      local_18._M_node =
           (_Base_ptr)
           std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
           erase_abi_cxx11_(in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
    }
    else {
      puVar2 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                         ((_Rb_tree_const_iterator<unsigned_long> *)0x123236);
      in_stack_ffffffffffffff88._M_node = (_Base_ptr)*puVar2;
      puVar2 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                         ((_Rb_tree_const_iterator<unsigned_long> *)0x123248);
      if (in_stack_ffffffffffffff88._M_node < (_Base_ptr)*puVar2) {
        std::_Rb_tree_const_iterator<unsigned_long>::operator++
                  ((_Rb_tree_const_iterator<unsigned_long> *)in_stack_ffffffffffffff80);
      }
      else {
        std::_Rb_tree_const_iterator<unsigned_long>::operator++
                  ((_Rb_tree_const_iterator<unsigned_long> *)in_stack_ffffffffffffff80);
        std::_Rb_tree_const_iterator<unsigned_long>::operator++
                  ((_Rb_tree_const_iterator<unsigned_long> *)in_stack_ffffffffffffff80);
      }
    }
  }
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
            (in_stack_ffffffffffffff78);
  __first._M_node._7_1_ = uVar3;
  __first._M_node._0_7_ = in_stack_ffffffffffffff98;
  std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::erase_abi_cxx11_
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             in_stack_ffffffffffffff88._M_node,__first,in_stack_ffffffffffffff90);
  return in_RDI;
}

Assistant:

Roaring64Map &operator&=(const Roaring64Map &r) {
        plain &= r.plain;

        auto it = check.begin();
        auto r_it = r.check.begin();
        while (it != check.end() && r_it != r.check.end()) {
            if (*it < *r_it) {
                it = check.erase(it);
            } else if (*r_it < *it) {
                ++r_it;
            } else {
                ++it;
                ++r_it;
            }  // overlapped
        }
        check.erase(it, check.end());  // erase rest of check not in r.check

        return *this;
    }